

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lazy_segtree_test.cpp
# Opt level: O3

void __thiscall
LazySegtree_BenchmarkN100000Q100000_Test::TestBody(LazySegtree_BenchmarkN100000Q100000_Test *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ll rhs;
  BiggestInt lhs;
  char *message;
  int to;
  int qi;
  uint uVar5;
  int fr;
  undefined1 local_80 [8];
  Segtree tree;
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  
  local_80 = (undefined1  [8])0xde0b6b3a7640000;
  tree.INF = 0x186a000000000;
  tree.l = 0;
  tree.r = 0;
  tree.val = 0;
  tree.lazy = 0;
  tree.lson = (Segtree *)0x0;
  lhs = 0;
  uVar5 = 0;
  do {
    iVar2 = rand();
    iVar3 = rand();
    iVar3 = ((iVar3 / 0x32) * 0x32 - iVar3) + 100000;
    if ((uVar5 & 1) == 0) {
      Segtree::rangeQuery((Segtree *)local_80,iVar2 % 0x32,iVar3);
    }
    else {
      iVar4 = rand();
      Segtree::rangeUpdate((Segtree *)local_80,iVar2 % 0x32,iVar3,(long)(iVar4 % 1000000));
      lhs = lhs + iVar4 % 1000000;
    }
    uVar5 = uVar5 + 1;
  } while (uVar5 != 100000);
  rhs = Segtree::rangeQuery((Segtree *)local_80,50000,0xc351);
  testing::internal::CmpHelperEQ((internal *)&tree.rson,"tot","tree.rangeQuery(n/2, n/2+1)",lhs,rhs)
  ;
  if ((char)tree.rson == '\0') {
    testing::Message::Message((Message *)&local_38);
    if (gtest_ar._0_8_ == 0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/trinerdi[P]icpc-notebook/src/trinerdi/data-structures/lazy_segtree_test.cpp"
               ,0x5b,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar.message_,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    if (local_38.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_38.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_38.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  Segtree::~Segtree((Segtree *)local_80);
  return;
}

Assistant:

TEST(LazySegtree, BenchmarkN100000Q100000) {
    int n = 100000;
    int q = 100000;
    int margin = 50;

    Segtree tree(0,n);
    ll tot = 0;
    rep(qi, 0, q) {
        if (qi % 2 == 0) {
            int fr = rand() % margin;
            int to = n - rand() % margin;
            tree.rangeQuery(fr, to);
        } else {
            int fr = rand() % margin;
            int to = n - rand() % margin;
            ll val = rand() % 1000000;
            tot += val;
            tree.rangeUpdate(fr, to, val);
        }
    }
    EXPECT_EQ(tot, tree.rangeQuery(n/2, n/2+1));
}